

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_str_split(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *zString;
  jx9_value *pValue;
  jx9_value *pVal;
  char *pcVar2;
  int nLen_00;
  int nLen;
  jx9_context *local_38;
  
  if ((0 < nArg) && (zString = jx9_value_to_string(*apArg,&nLen), 0 < nLen)) {
    if (nArg == 1) {
      nLen_00 = 1;
    }
    else {
      iVar1 = jx9_value_to_int(apArg[1]);
      if (iVar1 < 1) goto LAB_0012c615;
      nLen_00 = nLen;
      if (iVar1 < nLen) {
        nLen_00 = iVar1;
      }
    }
    pValue = jx9_context_new_array(pCtx);
    pVal = jx9_context_new_scalar(pCtx);
    if (pValue != (jx9_value *)0x0 && pVal != (jx9_value *)0x0) {
      pcVar2 = zString + nLen;
      local_38 = pCtx;
      for (; zString < pcVar2; zString = zString + nLen_00) {
        iVar1 = (int)pcVar2 - (int)zString;
        if (iVar1 <= nLen_00) {
          nLen_00 = iVar1;
        }
        jx9_value_string(pVal,zString,nLen_00);
        jx9_array_add_elem(pValue,(jx9_value *)0x0,pVal);
        SyBlobReset(&pVal->sBlob);
      }
      jx9_result_value(local_38,pValue);
      return 0;
    }
  }
LAB_0012c615:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_str_split(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zEnd;
	jx9_value *pArray, *pValue;
	int split_len;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	split_len = (int)sizeof(char);
	if( nArg > 1 ){
		/* Split length */
		split_len = jx9_value_to_int(apArg[1]);
		if( split_len < 1 ){
			/* Invalid length, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		if( split_len > nLen ){
			split_len = nLen;
		}
	}
	/* Create the array and the scalar value */
	pArray = jx9_context_new_array(pCtx);
	/*Chunk value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 || pArray == 0 ){
		/* Return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the end of the string */
	zEnd = &zString[nLen];
	/* Perform the requested operation */
	for(;;){
		int nMax;
		if( zString >= zEnd ){
			/* No more input to process */
			break;
		}
		nMax = (int)(zEnd-zString);
		if( nMax < split_len ){
			split_len = nMax;
		}
		/* Copy the current chunk */
		jx9_value_string(pValue, zString, split_len);
		/* Insert it */
		jx9_array_add_elem(pArray, 0, pValue); /* Will make it's own copy */
		/* reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* Update position */
		zString += split_len;
	}
	/* 
	 * Return the array.
	 * Don't worry about freeing memory, everything will be automatically released
	 * upon we return from this function.
	 */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}